

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

QVariant * __thiscall
QTableWidgetItem::data(QVariant *__return_storage_ptr__,QTableWidgetItem *this,int role)

{
  int iVar1;
  long lVar2;
  QWidgetItemData *pQVar3;
  bool bVar4;
  
  iVar1 = 0;
  if (role != 2) {
    iVar1 = role;
  }
  lVar2 = (this->values).d.size;
  bVar4 = lVar2 == 0;
  if (!bVar4) {
    pQVar3 = (this->values).d.ptr;
    if (pQVar3->role != iVar1) {
      lVar2 = lVar2 * 0x28;
      do {
        lVar2 = lVar2 + -0x28;
        bVar4 = lVar2 == 0;
        if (bVar4) goto LAB_005a02ab;
        pQVar3 = pQVar3 + 1;
      } while (pQVar3->role != iVar1);
    }
    ::QVariant::QVariant(__return_storage_ptr__,&pQVar3->value);
    if (!bVar4) {
      return __return_storage_ptr__;
    }
  }
LAB_005a02ab:
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  return __return_storage_ptr__;
}

Assistant:

QVariant QTableWidgetItem::data(int role) const
{
    role = (role == Qt::EditRole ? Qt::DisplayRole : role);
    for (const auto &value : values) {
        if (value.role == role)
            return value.value;
    }
    return QVariant();
}